

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

parsing_result * clipp::parse(int argc,char **argv,group *cli,arg_index offset)

{
  int in_ESI;
  parsing_result *in_RDI;
  int in_R8D;
  arg_list args;
  arg_list *in_stack_00000080;
  parsing_result *__first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb0;
  arg_index in_stack_ffffffffffffffbc;
  group *in_stack_ffffffffffffffc0;
  arg_list *in_stack_ffffffffffffffc8;
  
  __first = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x18abe3);
  if (in_R8D < in_ESI) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::assign<char**,void>
              (in_stack_ffffffffffffffb0,(char **)__first,(char **)in_RDI);
  }
  detail::anon_unknown_6::sanitize_args(in_stack_00000080);
  detail::anon_unknown_6::parse_and_execute
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffffb0);
  return __first;
}

Assistant:

inline parsing_result
parse(const int argc, char* argv[], const group& cli, arg_index offset = 1)
{
    arg_list args;
    if(offset < argc) args.assign(argv+offset, argv+argc);
    detail::sanitize_args(args);
    return detail::parse_and_execute(args, cli, offset);
}